

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<double,signed_char>
          (BaseAppender *this,Vector *col,double input)

{
  data_t dVar1;
  
  dVar1 = Cast::Operation<double,signed_char>(input);
  col->data[(this->chunk).count] = dVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}